

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_raster.cpp
# Opt level: O0

void __thiscall QRasterPlatformPixmap::resize(QRasterPlatformPixmap *this,int width,int height)

{
  long lVar1;
  bool bVar2;
  PixelType PVar3;
  int iVar4;
  qint64 qVar5;
  int in_EDX;
  int in_ESI;
  QPlatformPixmap *in_RDI;
  long in_FS_OFFSET;
  Format format;
  QImage *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  GlobalColor color;
  undefined4 in_stack_ffffffffffffffa8;
  Format FVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  PVar3 = QPlatformPixmap::pixelType(in_RDI);
  if (PVar3 == BitmapType) {
    FVar6 = Format_MonoLSB;
  }
  else {
    FVar6 = systemNativeFormat();
  }
  QImage::QImage((QImage *)in_RDI,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                 (Format)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  QImage::operator=((QImage *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    in_stack_ffffffffffffff90);
  QImage::~QImage(in_stack_ffffffffffffff90);
  in_RDI->w = in_ESI;
  in_RDI->h = in_EDX;
  iVar4 = QImage::depth((QImage *)(in_RDI + 1));
  in_RDI->d = iVar4;
  color = CONCAT13(1,(int3)in_stack_ffffffffffffff9c);
  if (0 < in_RDI->w) {
    color = CONCAT13(in_RDI->h < 1,(int3)in_stack_ffffffffffffff9c);
  }
  in_RDI->is_null = SUB41(color >> 0x18,0);
  PVar3 = QPlatformPixmap::pixelType(in_RDI);
  if (PVar3 == BitmapType) {
    bVar2 = QImage::isNull((QImage *)(in_RDI + 1));
    if (!bVar2) {
      QImage::setColorCount
                ((QImage *)CONCAT44(FVar6,in_stack_ffffffffffffffa8),(int)((ulong)in_RDI >> 0x20));
      QColor::QColor((QColor *)in_RDI,color);
      QColor::rgba((QColor *)in_RDI);
      QImage::setColor((QImage *)CONCAT44(FVar6,in_stack_ffffffffffffffa8),
                       (int)((ulong)in_RDI >> 0x20),(QRgb)in_RDI);
      QColor::QColor((QColor *)in_RDI,color);
      QColor::rgba((QColor *)in_RDI);
      QImage::setColor((QImage *)CONCAT44(FVar6,in_stack_ffffffffffffffa8),
                       (int)((ulong)in_RDI >> 0x20),(QRgb)in_RDI);
    }
  }
  qVar5 = QImage::cacheKey((QImage *)(in_RDI + 1));
  QPlatformPixmap::setSerialNumber(in_RDI,(int)((ulong)qVar5 >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPlatformPixmap::resize(int width, int height)
{
    QImage::Format format;
    if (pixelType() == BitmapType)
        format = QImage::Format_MonoLSB;
    else
        format = systemNativeFormat();

    image = QImage(width, height, format);
    w = width;
    h = height;
    d = image.depth();
    is_null = (w <= 0 || h <= 0);

    if (pixelType() == BitmapType && !image.isNull()) {
        image.setColorCount(2);
        image.setColor(0, QColor(Qt::color0).rgba());
        image.setColor(1, QColor(Qt::color1).rgba());
    }

    setSerialNumber(image.cacheKey() >> 32);
}